

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O3

int xmlconfTestCases(xmlDocPtr doc,xmlNodePtr cur,int level)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *__s2;
  stat64 *psVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  int *piVar13;
  uint uVar14;
  uint uVar15;
  char **ppcVar16;
  uint uVar17;
  stat64 *psVar18;
  char *pcVar19;
  int level_00;
  int iVar20;
  _xmlNode *cur_00;
  char buf [500];
  char *local_298;
  long local_290;
  char *local_288;
  long local_260;
  stat64 local_228 [3];
  
  level_00 = 2;
  iVar20 = 0;
  if (level == 1) {
    lVar5 = xmlGetProp(cur,"PROFILE");
    if (lVar5 != 0) {
      printf("Test cases: %s\n",lVar5);
      (*_xmlFree)(lVar5);
      bVar2 = 1;
      goto LAB_0010290d;
    }
    level_00 = 1;
  }
  bVar2 = 0;
LAB_0010290d:
  cur_00 = cur->children;
  if (cur_00 != (_xmlNode *)0x0) {
    uVar17 = 0;
    iVar20 = 0;
    do {
      if (cur_00->type == XML_ELEMENT_NODE) {
        iVar3 = xmlStrEqual(cur_00->name,"TESTCASES");
        if (iVar3 == 0) {
          iVar3 = xmlStrEqual(cur_00->name,"TEST");
          if (iVar3 == 0) {
            xmlconfTestCases_cold_1();
          }
          else {
            testErrorsSize = 0;
            testErrors[0] = '\0';
            nbError = 0;
            nbFatal = 0;
            __s2 = (char *)xmlGetProp(cur_00,"ID");
            if (__s2 == (char *)0x0) {
              uVar11 = xmlGetLineNo(cur_00);
              test_log("test missing ID, line %ld\n",uVar11);
            }
            else {
              if (skipped_tests[0] != (char *)0x0) {
                ppcVar16 = skipped_tests;
                pcVar19 = skipped_tests[0];
                do {
                  ppcVar16 = ppcVar16 + 1;
                  iVar3 = strcmp(pcVar19,__s2);
                  if (iVar3 == 0) {
                    uVar15 = 0;
                    test_log("Skipping test %s from skipped list\n",__s2);
                    nb_skipped = nb_skipped + 1;
                    goto LAB_00103020;
                  }
                  pcVar19 = *ppcVar16;
                } while (pcVar19 != (char *)0x0);
              }
              lVar5 = xmlGetProp(cur_00,"TYPE");
              if (lVar5 == 0) {
                test_log("test %s missing TYPE\n",__s2);
                uVar15 = 0xffffffff;
LAB_00103020:
                (*_xmlFree)(__s2);
              }
              else {
                psVar6 = (stat64 *)xmlGetProp(cur_00,"URI");
                if (psVar6 == (stat64 *)0x0) {
                  test_log("test %s missing URI\n",__s2);
                  local_298 = (char *)0x0;
                  lVar7 = 0;
LAB_00102cf1:
                  uVar15 = 0xffffffff;
                  local_288 = (char *)0x0;
LAB_00102fd2:
                  (*_xmlFree)(lVar5);
                }
                else {
                  lVar7 = xmlNodeGetBase(doc,cur_00);
                  psVar18 = psVar6;
                  if (lVar7 != 0) {
                    snprintf((char *)local_228,500,"%s/%s",lVar7,psVar6);
                    psVar18 = local_228;
                  }
                  local_298 = (char *)xmlStrdup(psVar18);
                  iVar3 = stat64(local_298,local_228);
                  if ((iVar3 == -1) || ((local_228[0].st_mode & 0xf000) != 0x8000)) {
                    pcVar19 = local_298;
                    if (local_298 == (char *)0x0) {
                      pcVar19 = "NULL";
                    }
                    test_log("test %s missing file %s \n",__s2,pcVar19);
                    goto LAB_00102cf1;
                  }
                  lVar8 = xmlGetProp(cur_00,"VERSION");
                  lVar9 = xmlGetProp(cur_00,"ENTITIES");
                  iVar3 = xmlStrEqual(lVar9,"none");
                  uVar14 = 0;
                  if (iVar3 == 0) {
                    uVar14 = 6;
                  }
                  local_288 = (char *)xmlGetProp(cur_00,"RECOMMENDATION");
                  if ((((local_288 == (char *)0x0) ||
                       (iVar3 = xmlStrEqual(local_288,"XML1.0"), iVar3 != 0)) ||
                      (iVar3 = xmlStrEqual(local_288,"XML1.0-errata2e"), iVar3 != 0)) ||
                     ((iVar3 = xmlStrEqual(local_288,"XML1.0-errata3e"), iVar3 != 0 ||
                      (iVar3 = xmlStrEqual(local_288,"XML1.0-errata4e"), iVar3 != 0)))) {
                    bVar1 = true;
                    if ((lVar8 == 0) || (iVar3 = xmlStrEqual(lVar8,"1.0"), iVar3 != 0))
                    goto LAB_00102b7d;
                    local_260 = 0;
                    test_log("Skipping test %s for %s\n",__s2,lVar8);
                    nb_skipped = nb_skipped + 1;
                    uVar15 = 0;
                  }
                  else {
                    iVar3 = xmlStrEqual(local_288,"NS1.0");
                    if (iVar3 == 0) {
                      iVar3 = xmlStrEqual(local_288,"NS1.0-errata1e");
                      bVar1 = false;
                      uVar15 = 0;
                      if (iVar3 == 0) {
                        test_log("Skipping test %s for REC %s\n",__s2,local_288);
                        nb_skipped = nb_skipped + 1;
                        local_260 = 0;
                        goto LAB_00102f91;
                      }
                    }
                    else {
                      bVar1 = false;
                    }
LAB_00102b7d:
                    local_260 = xmlGetProp(cur_00,"EDITION");
                    uVar15 = uVar14;
                    if (local_260 != 0) {
                      lVar10 = xmlStrchr(local_260,0x35);
                      uVar15 = uVar14 + 0x20000;
                      if (lVar10 != 0) {
                        uVar15 = uVar14;
                      }
                    }
                    xmlResetLastError();
                    testErrorsSize = 0;
                    testErrors[0] = '\0';
                    iVar3 = xmlMemUsed();
                    iVar4 = xmlStrEqual(lVar5,"not-wf");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(lVar5,"valid");
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(lVar5,"invalid");
                        if (iVar4 == 0) {
                          iVar3 = xmlStrEqual(lVar5,"error");
                          if (iVar3 == 0) {
                            test_log("test %s unknown TYPE value %s\n",__s2,lVar5);
                            uVar15 = 0xffffffff;
                          }
                          else {
                            uVar15 = 0;
                            test_log("Skipping error test %s \n",__s2);
                            nb_skipped = nb_skipped + 1;
                          }
                          goto LAB_00102f91;
                        }
                        local_290 = xmlNewParserCtxt();
                        if (local_290 != 0) {
                          lVar10 = xmlCtxtReadFile(local_290,local_298,0,uVar15 | 0x10);
                          if (lVar10 != 0) {
                            if ((*(int *)(local_290 + 0x98) != 0) ||
                               ((*(byte *)(lVar10 + 0xac) & 8) != 0)) {
                              pcVar19 = "test %s : %s failed to detect invalid document\n";
                              goto LAB_00102e71;
                            }
                            goto LAB_00102e8f;
                          }
                          test_log("test %s : %s invalid document turned not well-formed too\n",__s2
                                   ,local_298);
                          goto LAB_00102f3d;
                        }
                      }
                      else {
                        local_290 = xmlNewParserCtxt();
                        if (local_290 != 0) {
                          lVar10 = xmlCtxtReadFile(local_290,local_298,0,uVar15 | 0x10);
                          if (lVar10 == 0) {
                            test_log("test %s : %s failed to parse a valid document\n",__s2,
                                     local_298);
                            nb_errors = nb_errors + 1;
                          }
                          else {
                            if ((*(int *)(local_290 + 0x98) == 0) ||
                               ((*(byte *)(lVar10 + 0xac) & 8) == 0)) {
                              pcVar19 = "test %s : %s failed to validate a valid document\n";
LAB_00102e71:
                              test_log(pcVar19,__s2,local_298);
                              nb_errors = nb_errors + 1;
                            }
LAB_00102e8f:
                            xmlFreeDoc(lVar10);
                          }
LAB_00102f3d:
                          xmlFreeParserCtxt(local_290);
                          goto LAB_00102f45;
                        }
                      }
                      test_log("test %s : %s out of memory\n",__s2,local_298);
                    }
                    else {
                      lVar10 = xmlReadFile(local_298,0,uVar15);
                      if (bVar1) {
                        if (lVar10 != 0) {
                          pcVar19 = "test %s : %s failed to detect not well formedness\n";
LAB_00102dba:
                          test_log(pcVar19,__s2,local_298);
                          nb_errors = nb_errors + 1;
LAB_00102dc7:
                          xmlFreeDoc(lVar10);
                        }
                      }
                      else {
                        if (lVar10 != 0) {
                          lVar12 = __xmlLastError();
                          if ((*(int *)(lVar12 + 4) == 0) ||
                             (piVar13 = (int *)__xmlLastError(), *piVar13 != 3)) {
                            pcVar19 = "test %s : %s failed to detect namespace error\n";
                            goto LAB_00102dba;
                          }
                          goto LAB_00102dc7;
                        }
                        test_log("test %s : %s failed to parse the XML\n",__s2,local_298);
                        nb_errors = nb_errors + 1;
                      }
                    }
LAB_00102f45:
                    xmlResetLastError();
                    iVar4 = xmlMemUsed();
                    uVar15 = iVar4 - iVar3;
                    if (uVar15 != 0 && iVar3 <= iVar4) {
                      test_log("test %s : %s leaked %d bytes\n",__s2,local_298,(ulong)uVar15);
                      nb_leaks = nb_leaks + 1;
                      xmlMemDisplayLast(logfile,(long)(int)uVar15);
                    }
                    nb_tests = nb_tests + 1;
                    uVar15 = 1;
                  }
LAB_00102f91:
                  (*_xmlFree)(lVar5);
                  if (lVar9 != 0) {
                    (*_xmlFree)();
                  }
                  if (local_260 != 0) {
                    (*_xmlFree)();
                  }
                  lVar5 = lVar8;
                  if (lVar8 != 0) goto LAB_00102fd2;
                }
                if (local_298 != (char *)0x0) {
                  (*_xmlFree)();
                }
                if (psVar6 != (stat64 *)0x0) {
                  (*_xmlFree)(psVar6);
                }
                if (lVar7 != 0) {
                  (*_xmlFree)(lVar7);
                }
                (*_xmlFree)(__s2);
                __s2 = local_288;
                if (local_288 != (char *)0x0) goto LAB_00103020;
              }
              iVar20 = iVar20 - ((int)~uVar15 >> 0x1f);
            }
            uVar17 = uVar17 + 1;
          }
        }
        else {
          iVar3 = xmlconfTestCases(doc,cur_00,level_00);
          iVar20 = iVar20 + iVar3;
        }
      }
      cur_00 = cur_00->next;
    } while (cur_00 != (_xmlNode *)0x0);
    if ((bool)(bVar2 & 0 < (int)uVar17)) {
      printf("Test cases: %d tests\n",(ulong)uVar17);
    }
  }
  return iVar20;
}

Assistant:

static int
xmlconfTestCases(xmlDocPtr doc, xmlNodePtr cur, int level) {
    xmlChar *profile;
    int ret = 0;
    int tests = 0;
    int output = 0;

    if (level == 1) {
	profile = xmlGetProp(cur, BAD_CAST "PROFILE");
	if (profile != NULL) {
	    output = 1;
	    level++;
	    printf("Test cases: %s\n", (char *) profile);
	    xmlFree(profile);
	}
    }
    cur = cur->children;
    while (cur != NULL) {
        /* look only at elements we ignore everything else */
        if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlStrEqual(cur->name, BAD_CAST "TESTCASES")) {
	        ret += xmlconfTestCases(doc, cur, level);
	    } else if (xmlStrEqual(cur->name, BAD_CAST "TEST")) {
	        if (xmlconfTestItem(doc, cur) >= 0)
		    ret++;
		tests++;
	    } else {
	        fprintf(stderr, "Unhandled element %s\n", (char *)cur->name);
	    }
	}
        cur = cur->next;
    }
    if (output == 1) {
	if (tests > 0)
	    printf("Test cases: %d tests\n", tests);
    }
    return(ret);
}